

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void multi_client_performance(size_t n)

{
  bool bVar1;
  iterator __lhs;
  ulong in_RDI;
  shared_ptr<std::thread> *p;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> *__range1;
  int i;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> group;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<std::shared_ptr<std::thread>_*,_std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>_>
  in_stack_ffffffffffffffa8;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
  *in_stack_ffffffffffffffb0;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> *this;
  _func_void *in_stack_ffffffffffffffc8;
  int local_24;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> local_20;
  ulong local_8;
  
  local_8 = in_RDI;
  std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::vector
            ((vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> *
             )0x1aeb93);
  for (local_24 = 0; (ulong)(long)local_24 < local_8; local_24 = local_24 + 1) {
    std::make_shared<std::thread,void(&)()>(in_stack_ffffffffffffffc8);
    std::vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>>::
    emplace_back<std::shared_ptr<std::thread>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8._M_current);
    std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)0x1aebd5);
  }
  this = &local_20;
  std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::begin
            (in_stack_ffffffffffffff98);
  __lhs = std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
          ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<std::thread>_*,_std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<std::shared_ptr<std::thread>_*,_std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    in_stack_ffffffffffffff98 =
         (vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> *)
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<std::thread>_*,_std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>_>
         ::operator*((__normal_iterator<std::shared_ptr<std::thread>_*,_std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>_>
                      *)&stack0xffffffffffffffa8);
    std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1aec63);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<std::thread>_*,_std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<std::thread>_*,_std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>_>
                  *)&stack0xffffffffffffffa8);
  }
  std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::~vector
            (this);
  return;
}

Assistant:

void multi_client_performance(size_t n) {
  std::vector<std::shared_ptr<std::thread>> group;
  for (int i = 0; i < n; ++i) {
    group.emplace_back(std::make_shared<std::thread>(
        test_performance1)); // []{test_performance1();});
  }
  for (auto &p : group) {
    p->join();
  }
}